

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O0

int ncnn::gemm_x86(Mat *A,Mat *B,Mat *C,Mat *top_blob,int broadcast_type_C,int transA,int transB,
                  int output_transpose,int constant_TILE_M,int constant_TILE_N,int constant_TILE_K,
                  int nT,Option *opt)

{
  void **ppvVar1;
  int *piVar2;
  undefined1 *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000030;
  bool k_end;
  Mat BT_tile_1;
  Mat AT_tile;
  int max_kk_1;
  int k_1;
  Mat *CT_tile;
  int max_jj_1;
  int j_1;
  Mat topT_tile;
  int max_ii;
  int K_1;
  int M_1;
  int i;
  int ppi;
  Mat topT;
  Mat BT_tile;
  int max_kk;
  int max_jj;
  int k;
  int j;
  int ppk;
  int ppj;
  int ppjk;
  int nn_NK;
  Mat BT;
  Mat ATX;
  int nn_K;
  int nn_N;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int N;
  int K;
  int M;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  int in_stack_00003ad0;
  int in_stack_00003ad8;
  int in_stack_00003ae0;
  int in_stack_00003ae8;
  int in_stack_00003af0;
  int in_stack_00003af8;
  undefined4 in_stack_fffffffffffff3e4;
  undefined4 in_stack_fffffffffffff3e8;
  undefined4 in_stack_fffffffffffff3ec;
  int in_stack_fffffffffffff3f4;
  int in_stack_fffffffffffff3f8;
  int in_stack_fffffffffffff3fc;
  Mat *in_stack_fffffffffffff400;
  int in_stack_fffffffffffff440;
  int in_stack_fffffffffffff444;
  undefined8 in_stack_fffffffffffff448;
  Mat *pMVar3;
  undefined8 in_stack_fffffffffffff450;
  int in_stack_fffffffffffff460;
  int in_stack_fffffffffffff464;
  int *in_stack_fffffffffffff468;
  Mat *in_stack_fffffffffffff470;
  Mat *in_stack_fffffffffffff478;
  void **in_stack_fffffffffffff480;
  int *in_stack_fffffffffffff488;
  int i_00;
  Mat *in_stack_fffffffffffff490;
  Mat *in_stack_fffffffffffff498;
  undefined1 *local_b40;
  int local_aec;
  int local_ae8;
  int local_ae4;
  int local_ae0;
  bool local_a7d;
  bool local_a55;
  int local_a54;
  int local_a50;
  int local_a4c;
  int local_a48;
  int local_a44;
  int local_a40;
  int local_a38 [8];
  Allocator *local_a18;
  undefined4 local_a10;
  undefined4 local_a0c;
  undefined4 local_a08;
  undefined4 local_a04;
  undefined4 local_a00;
  undefined8 local_9f8;
  Mat local_9f0;
  Mat local_9a8;
  Mat local_960;
  int local_914;
  int local_910;
  int local_90c;
  undefined1 *local_908;
  int local_8fc;
  int local_8f8;
  int local_8f4;
  void *local_8f0;
  undefined8 local_8e8;
  long local_8e0;
  undefined4 local_8d8;
  long *local_8d0;
  undefined4 local_8c8;
  int local_8c4;
  int in_stack_fffffffffffff740;
  int in_stack_fffffffffffff744;
  int in_stack_fffffffffffff748;
  int in_stack_fffffffffffff74c;
  Mat *in_stack_fffffffffffff750;
  Mat *in_stack_fffffffffffff758;
  int local_860;
  int local_85c;
  int local_858;
  int local_854;
  int local_850;
  int local_84c;
  void *local_848;
  int *local_840;
  long local_838;
  undefined4 local_830;
  long *local_828;
  undefined4 local_820;
  int local_81c;
  int local_818;
  undefined4 local_814;
  int in_stack_fffffffffffff7f0;
  int iVar4;
  int in_stack_fffffffffffff7f4;
  undefined4 in_stack_fffffffffffff7f8;
  undefined4 in_stack_fffffffffffff7fc;
  undefined8 uVar5;
  long lVar6;
  void *local_7b8;
  int *local_7b0;
  size_t local_7a8;
  int local_7a0;
  Allocator *local_798;
  undefined4 local_790;
  int local_78c;
  undefined4 local_788;
  undefined4 local_784;
  undefined4 local_780;
  long local_778;
  int local_770;
  int local_76c;
  int local_768;
  int local_764;
  int local_760;
  int local_75c;
  int local_758;
  int local_754;
  int local_750;
  int local_74c;
  void *local_748;
  int *local_740;
  size_t local_738;
  int local_730;
  Allocator *local_728;
  undefined4 local_720;
  int local_71c;
  int local_718;
  undefined4 local_714;
  int local_710;
  long local_708;
  undefined4 local_700;
  void *local_6f0;
  int *local_6e8;
  size_t local_6e0;
  int local_6d8;
  Allocator *local_6d0;
  undefined4 local_6c8;
  int local_6c4;
  int local_6c0;
  undefined4 local_6bc;
  int local_6b8;
  long local_6b0;
  int local_6a4;
  int local_6a0;
  int local_69c;
  int local_698;
  int local_694;
  int local_690;
  int local_68c;
  int local_688;
  int local_684;
  int local_680;
  int local_67c;
  undefined1 *local_670;
  long local_660;
  int local_654;
  void **local_650;
  undefined1 *local_648;
  undefined1 *local_640;
  void **local_630;
  void **local_628;
  Mat *local_618;
  int *local_608;
  Mat *local_5f8;
  Mat *local_5e8;
  undefined1 *local_5d8;
  void **local_5c8;
  void **local_5b8;
  void **local_5a8;
  void **local_598;
  void **local_590;
  void **local_588;
  undefined1 local_57d;
  int local_57c;
  void **local_578;
  int *local_570;
  undefined1 local_55d;
  int local_55c;
  void **local_558;
  Mat *local_550;
  undefined1 local_53d;
  int local_53c;
  void **local_538;
  void **local_530;
  undefined1 local_51d;
  int local_51c;
  void **local_518;
  undefined1 *local_510;
  undefined4 local_500;
  int local_4fc;
  int *local_4f8;
  Mat *local_4f0;
  undefined4 local_4e8;
  int local_4e4;
  Mat *local_4e0;
  Mat *local_4d8;
  undefined4 local_4d0;
  int local_4cc;
  undefined1 *local_4c8;
  void **local_4c0;
  int local_468;
  undefined4 local_464;
  void **local_460;
  int local_448;
  undefined4 local_444;
  void **local_440;
  int local_428;
  undefined4 local_424;
  void **local_420;
  undefined1 *local_400;
  int local_3e8;
  undefined4 local_3e4;
  Mat *local_3e0;
  int local_3c8;
  undefined4 local_3c4;
  Mat *local_3c0;
  int *local_3a0;
  Mat *local_380;
  void **local_360;
  int local_358;
  undefined4 local_354;
  void **local_350;
  undefined1 *local_330;
  void **local_320;
  void **local_318;
  void **local_310;
  void **local_300;
  void **local_2f8;
  void **local_2f0;
  void **local_2e8;
  Allocator *local_2e0;
  int local_2d4;
  size_t local_2d0;
  void *local_2c8;
  undefined4 local_2bc;
  int local_2b8;
  int local_2b4;
  undefined1 *local_2b0;
  long *local_2a8;
  undefined4 local_29c;
  long local_298;
  void *local_290;
  undefined4 local_284;
  int local_280;
  int local_27c;
  void **local_278;
  Allocator *local_270;
  int local_264;
  size_t local_260;
  void *local_258;
  undefined4 local_24c;
  int local_248;
  int local_244;
  Mat *local_240;
  Allocator *local_238;
  int local_22c;
  size_t local_228;
  void *local_220;
  undefined4 local_214;
  int local_210;
  int local_20c;
  int *local_208;
  undefined4 local_1fc;
  long local_1f8;
  undefined4 local_1ec;
  long local_1e8;
  undefined4 local_1dc;
  long local_1d8;
  undefined4 local_1cc;
  long local_1c8;
  Allocator *local_1c0;
  int local_1b4;
  size_t local_1b0;
  void *local_1a8;
  undefined4 local_1a0;
  int local_19c;
  void **local_198;
  Allocator *local_190;
  int local_184;
  size_t local_180;
  Mat *local_178;
  undefined4 local_170;
  int local_16c;
  Mat *local_168;
  Allocator *local_160;
  int local_154;
  size_t local_150;
  Mat *local_148;
  undefined4 local_140;
  int local_13c;
  Mat *local_138;
  void *local_118;
  undefined1 in_stack_ffffffffffffff1b;
  int in_stack_ffffffffffffff1c;
  Mat *in_stack_ffffffffffffff20;
  Mat *in_stack_ffffffffffffff28;
  Mat *in_stack_ffffffffffffff30;
  Mat *in_stack_ffffffffffffff38;
  Mat *in_stack_ffffffffffffff40;
  
  uVar5 = CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8);
  if (in_R9D == 0) {
    if (*(int *)(in_RDI + 0x28) == 3) {
      local_a44 = *(int *)(in_RDI + 0x38);
    }
    else {
      local_a44 = *(int *)(in_RDI + 0x30);
    }
    local_a40 = local_a44 * *(int *)(in_RDI + 0x18);
  }
  else {
    local_a40 = *(int *)(in_RDI + 0x2c);
  }
  local_684 = local_a40;
  if (in_R9D == 0) {
    local_a4c = *(int *)(in_RDI + 0x2c);
  }
  else {
    if (*(int *)(in_RDI + 0x28) == 3) {
      local_a48 = *(int *)(in_RDI + 0x38);
    }
    else {
      local_a48 = *(int *)(in_RDI + 0x30);
    }
    local_a4c = local_a48 * *(int *)(in_RDI + 0x18);
  }
  local_688 = local_a4c;
  if (in_stack_00000008 == 0) {
    local_a54 = *(int *)(in_RSI + 0x2c);
  }
  else {
    if (*(int *)(in_RSI + 0x28) == 3) {
      local_a50 = *(int *)(in_RSI + 0x38);
    }
    else {
      local_a50 = *(int *)(in_RSI + 0x30);
    }
    local_a54 = local_a50 * *(int *)(in_RSI + 0x18);
  }
  local_68c = local_a54;
  local_680 = in_R9D;
  local_67c = in_R8D;
  local_670 = in_RDX;
  local_660 = in_RDI;
  get_optimal_tile_mnk
            ((int)((ulong)in_stack_fffffffffffff450 >> 0x20),(int)in_stack_fffffffffffff450,
             (int)((ulong)in_stack_fffffffffffff448 >> 0x20),(int)in_stack_fffffffffffff448,
             in_stack_fffffffffffff444,in_stack_fffffffffffff440,
             (int *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460),
             in_stack_fffffffffffff468,(int *)in_stack_fffffffffffff470,
             (int)in_stack_fffffffffffff478);
  local_69c = (local_684 + local_690 + -1) / local_690;
  local_6a0 = (local_68c + local_694 + -1) / local_694;
  local_6a4 = (local_688 + local_698 + -1) / local_698;
  local_6f0 = (void *)0x0;
  local_6e8 = (int *)0x0;
  local_6e0 = 0;
  local_6d8 = 0;
  local_6d0 = (Allocator *)0x0;
  local_6c8 = 0;
  local_6c4 = 0;
  local_6c0 = 0;
  local_6bc = 0;
  local_6b8 = 0;
  local_6b0 = 0;
  Mat::create(in_stack_fffffffffffff400,in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8,
              in_stack_fffffffffffff3f4,
              CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8),
              (Allocator *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_00000030));
  local_588 = &local_6f0;
  if (local_6f0 != (void *)0x0) {
    local_2f8 = local_588;
  }
  local_a55 = local_6f0 == (void *)0x0 || local_6b0 * local_6b8 == 0;
  if (local_a55) {
    local_654 = -100;
    local_700 = 1;
    goto LAB_0184aa1d;
  }
  local_748 = (void *)0x0;
  local_740 = (int *)0x0;
  local_738 = 0;
  local_730 = 0;
  local_728 = (Allocator *)0x0;
  local_720 = 0;
  local_71c = 0;
  local_718 = 0;
  local_714 = 0;
  local_710 = 0;
  local_708 = 0;
  Mat::create(in_stack_fffffffffffff400,in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8,
              in_stack_fffffffffffff3f4,
              CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8),
              (Allocator *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_00000030));
  local_590 = &local_748;
  if (local_748 != (void *)0x0) {
    local_2f0 = local_590;
  }
  local_a7d = local_748 != (void *)0x0 && local_708 * local_710 != 0;
  if (local_a7d) {
    local_74c = local_6a0 * local_6a4;
    for (local_750 = 0; local_750 < local_74c; local_750 = local_750 + 1) {
      local_754 = local_750 / local_6a4;
      local_758 = local_750 % local_6a4;
      local_75c = local_754 * local_694;
      local_760 = local_758 * local_698;
      local_768 = local_68c - local_75c;
      piVar2 = std::min<int>(&local_768,&local_694);
      local_764 = *piVar2;
      local_770 = local_688 - local_760;
      piVar2 = std::min<int>(&local_770,&local_698);
      local_76c = *piVar2;
      local_51c = local_75c / local_694;
      local_510 = &stack0xfffffffffffff800;
      local_518 = &local_748;
      local_2c8 = (void *)((long)local_748 + local_708 * local_51c * local_738);
      local_2b0 = &stack0xfffffffffffff800;
      local_1c8 = (long)local_71c * (long)local_718 * local_738;
      local_4cc = local_760 / local_698;
      local_4c0 = &local_7b8;
      local_4c8 = &stack0xfffffffffffff800;
      local_1a8 = (void *)((long)local_2c8 + (long)local_71c * (long)local_4cc * local_738);
      local_198 = &local_7b8;
      local_778 = (long)local_71c;
      local_640 = &stack0xfffffffffffff800;
      local_780 = 1;
      local_784 = 1;
      local_788 = 1;
      local_78c = local_71c;
      local_790 = 2;
      local_798 = local_728;
      local_7a0 = local_730;
      local_7a8 = local_738;
      local_7b0 = (int *)0x0;
      local_19c = local_71c;
      local_1a0 = 1;
      local_1b0 = local_738;
      local_1b4 = local_730;
      local_1c0 = local_728;
      local_1cc = 0x10;
      local_2b4 = local_71c;
      local_2b8 = local_718;
      local_2bc = local_714;
      local_2d0 = local_738;
      local_2d4 = local_730;
      local_2e0 = local_728;
      local_4d0 = 1;
      local_51d = 1;
      local_330 = local_640;
      local_7b8 = local_1a8;
      if (in_stack_00000008 == 0) {
        transpose_pack_B_tile
                  (in_stack_fffffffffffff758,in_stack_fffffffffffff750,in_stack_fffffffffffff74c,
                   in_stack_fffffffffffff748,in_stack_fffffffffffff744,in_stack_fffffffffffff740);
      }
      else {
        pack_B_tile((Mat *)0x0,(Mat *)0x0,(int)((ulong)uVar5 >> 0x20),(int)uVar5,
                    in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0);
      }
      local_630 = &local_7b8;
      local_350 = local_630;
      if (local_7b0 != (int *)0x0) {
        local_354 = 0xffffffff;
        LOCK();
        local_358 = *local_7b0;
        *local_7b0 = *local_7b0 + -1;
        UNLOCK();
        if (local_358 == 1) {
          if (local_798 == (Allocator *)0x0) {
            local_118 = local_7b8;
            if (local_7b8 != (void *)0x0) {
              free(local_7b8);
            }
          }
          else {
            (*local_798->_vptr_Allocator[3])(local_798,local_7b8);
          }
        }
      }
      local_7b8 = (void *)0x0;
      local_7a8 = 0;
      local_7a0 = 0;
      local_790 = 0;
      local_78c = 0;
      local_788 = 0;
      local_784 = 0;
      local_780 = 0;
      local_778 = 0;
      local_7b0 = (int *)0x0;
    }
    local_650 = &local_848;
    local_848 = (void *)0x0;
    local_840 = (int *)0x0;
    local_838 = 0;
    local_830 = 0;
    local_828 = (long *)0x0;
    local_820 = 0;
    local_81c = 0;
    local_818 = 0;
    local_814 = 0;
    iVar4 = 0;
    lVar6 = 0;
    if (((local_698 < local_688) || (local_67c == 3)) || (in_stack_00000010 != 0)) {
      Mat::create(in_stack_fffffffffffff400,in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8,
                  in_stack_fffffffffffff3f4,
                  CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8),
                  (Allocator *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_00000030));
      local_598 = &local_848;
      if (local_848 != (void *)0x0) {
        local_2e8 = local_598;
      }
      if (local_848 != (void *)0x0 && lVar6 * iVar4 != 0) goto LAB_0184875b;
      local_654 = -100;
    }
    else {
LAB_0184875b:
      for (local_84c = 0; local_84c < local_69c; local_84c = local_84c + 1) {
        local_850 = local_84c * local_690;
        if (local_680 == 0) {
          if (*(int *)(local_660 + 0x28) == 3) {
            local_ae4 = *(int *)(local_660 + 0x38);
          }
          else {
            local_ae4 = *(int *)(local_660 + 0x30);
          }
          local_ae0 = local_ae4 * *(int *)(local_660 + 0x18);
        }
        else {
          local_ae0 = *(int *)(local_660 + 0x2c);
        }
        local_854 = local_ae0;
        if (local_680 == 0) {
          local_aec = *(int *)(local_660 + 0x2c);
        }
        else {
          if (*(int *)(local_660 + 0x28) == 3) {
            local_ae8 = *(int *)(local_660 + 0x38);
          }
          else {
            local_ae8 = *(int *)(local_660 + 0x30);
          }
          local_aec = local_ae8 * *(int *)(local_660 + 0x18);
        }
        local_858 = local_aec;
        local_860 = local_ae0 - local_850;
        piVar2 = std::min<int>(&local_860,&local_690);
        local_85c = *piVar2;
        local_648 = &stack0xfffffffffffff758;
        if (((local_698 < local_858) || (local_67c == 3)) || (in_stack_00000010 != 0)) {
          local_53c = get_omp_thread_num();
          local_530 = &local_8f0;
          local_538 = &local_848;
          local_290 = (void *)((long)local_848 + lVar6 * local_53c * local_838);
          local_278 = &local_8f0;
          local_8f0 = local_290;
          local_8e8 = 0;
          local_8e0 = local_838;
          local_8d8 = local_830;
          local_8d0 = local_828;
          local_8c4 = local_81c;
          local_1d8 = (long)local_81c * (long)local_818 * local_838;
          local_318 = (void **)&stack0xfffffffffffff758;
          local_320 = &local_8f0;
          ppvVar1 = local_318;
          if (local_318 == local_320) {
            ppvVar1 = local_300;
          }
          local_300 = ppvVar1;
          local_628 = &local_8f0;
          local_1dc = 0x10;
          local_27c = local_81c;
          local_280 = local_818;
          local_284 = local_814;
          local_298 = local_838;
          local_29c = local_830;
          local_2a8 = local_828;
          local_53d = 1;
          local_8f0 = (void *)0x0;
          local_8e0 = 0;
          local_8d8 = 0;
          local_8c8 = 0;
          local_8c4 = 0;
          local_8e8 = 0;
          local_360 = local_628;
          local_310 = local_318;
        }
        for (local_8f4 = 0; local_8f4 < local_68c; local_8f4 = local_694 + local_8f4) {
          local_8fc = local_68c - local_8f4;
          piVar2 = std::min<int>(&local_8fc,&local_694);
          local_8f8 = *piVar2;
          if (local_67c == 3) {
            pack_A_tile(in_stack_fffffffffffff498,in_stack_fffffffffffff490,
                        (int)((ulong)in_stack_fffffffffffff488 >> 0x20),
                        (int)in_stack_fffffffffffff488,
                        (int)((ulong)in_stack_fffffffffffff480 >> 0x20),
                        (int)in_stack_fffffffffffff480);
          }
          if (local_67c == 3) {
            local_b40 = &stack0xfffffffffffff758;
          }
          else {
            local_b40 = local_670;
          }
          local_908 = local_b40;
          for (local_90c = 0; local_90c < local_858; local_90c = local_698 + local_90c) {
            local_914 = local_858 - local_90c;
            piVar2 = std::min<int>(&local_914,&local_698);
            local_910 = *piVar2;
            local_55c = get_omp_thread_num();
            local_550 = &local_9a8;
            local_558 = &local_6f0;
            local_258 = (void *)((long)local_6f0 + local_6b0 * local_55c * local_6e0);
            local_240 = &local_9a8;
            local_1e8 = (long)local_6c4 * (long)local_6c0 * local_6e0;
            local_4e4 = local_90c / local_698;
            local_4d8 = &local_960;
            local_4e0 = &local_9a8;
            local_178 = (Mat *)((long)local_258 + (long)local_6c4 * (long)local_4e4 * local_6e0);
            in_stack_fffffffffffff498 = &local_960;
            local_960.cstep = (size_t)local_6c4;
            in_stack_fffffffffffff490 = &local_9a8;
            local_57c = local_8f4 / local_694;
            local_570 = local_a38;
            in_stack_fffffffffffff480 = &local_748;
            local_220 = (void *)((long)local_748 + local_708 * local_57c * local_738);
            in_stack_fffffffffffff488 = local_a38;
            local_1f8 = (long)local_71c * (long)local_718 * local_738;
            local_4fc = local_90c / local_698;
            local_4f0 = &local_9f0;
            local_4f8 = local_a38;
            local_148 = (Mat *)((long)local_220 + (long)local_71c * (long)local_4fc * local_738);
            in_stack_fffffffffffff470 = &local_9f0;
            local_9f0.cstep = (size_t)local_71c;
            in_stack_fffffffffffff468 = local_a38;
            local_960.c = 1;
            local_960.d = 1;
            local_960.h = 1;
            local_960.w = local_6c4;
            local_960.dims = 2;
            local_960.allocator = local_6d0;
            local_960.elempack = local_6d8;
            local_960.elemsize = local_6e0;
            local_960.refcount = (int *)0x0;
            local_9a8.c = 0;
            local_9a8.d = 0;
            local_9a8.h = 0;
            local_9a8.w = 0;
            local_9a8.allocator = local_6d0;
            local_9a8.elempack = 0;
            local_9a8.elemsize = 0;
            local_9a8.refcount = (int *)0x0;
            local_9a8.data = (void *)0x0;
            local_9f0.c = 1;
            local_9f0.d = 1;
            local_9f0.h = 1;
            local_9f0.w = local_71c;
            local_9f0.dims = 2;
            local_9f0.allocator = local_728;
            local_9f0.elempack = local_730;
            local_9f0.elemsize = local_738;
            local_9f0.refcount = (int *)0x0;
            local_a18 = local_728;
            local_13c = local_71c;
            local_140 = 1;
            local_150 = local_738;
            local_154 = local_730;
            local_160 = local_728;
            local_16c = local_6c4;
            local_170 = 1;
            local_180 = local_6e0;
            local_184 = local_6d8;
            local_190 = local_6d0;
            local_1ec = 0x10;
            local_1fc = 0x10;
            local_20c = local_71c;
            local_210 = local_718;
            local_214 = local_714;
            local_228 = local_738;
            local_22c = local_730;
            local_238 = local_728;
            local_244 = local_6c4;
            local_248 = local_6c0;
            local_24c = local_6bc;
            local_260 = local_6e0;
            local_264 = local_6d8;
            local_270 = local_6d0;
            local_4e8 = 1;
            local_500 = 1;
            local_55d = 1;
            local_57d = 1;
            local_9a8.cstep = 0;
            local_9a8.dims = 0;
            local_a38[0] = 0;
            local_a38[1] = 0;
            local_a38[4] = 0;
            local_a38[5] = 0;
            local_a38[6] = 0;
            local_a10 = 0;
            local_a0c = 0;
            local_a08 = 0;
            local_a04 = 0;
            local_a00 = 0;
            local_9f8 = 0;
            local_a38[2] = 0;
            local_a38[3] = 0;
            local_618 = in_stack_fffffffffffff490;
            local_608 = in_stack_fffffffffffff468;
            local_578 = in_stack_fffffffffffff480;
            local_3a0 = in_stack_fffffffffffff468;
            local_380 = in_stack_fffffffffffff490;
            local_208 = in_stack_fffffffffffff488;
            local_168 = in_stack_fffffffffffff498;
            local_138 = in_stack_fffffffffffff470;
            local_9f0.data = local_148;
            local_960.data = local_178;
            if (local_8f4 == 0) {
              iVar4 = (int)((ulong)in_stack_fffffffffffff480 >> 0x20);
              i_00 = (int)((ulong)in_stack_fffffffffffff488 >> 0x20);
              if (local_680 == 0) {
                pack_A_tile(in_stack_fffffffffffff498,in_stack_fffffffffffff490,i_00,
                            (int)in_stack_fffffffffffff488,iVar4,(int)in_stack_fffffffffffff480);
              }
              else {
                transpose_pack_A_tile
                          (in_stack_fffffffffffff498,in_stack_fffffffffffff490,i_00,
                           (int)in_stack_fffffffffffff488,iVar4,(int)in_stack_fffffffffffff480);
              }
            }
            gemm_transB_packed_tile
                      (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30
                       ,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                       in_stack_ffffffffffffff1c,in_stack_00003ad0,in_stack_00003ad8,
                       in_stack_00003ae0,in_stack_00003ae8,in_stack_00003af0,in_stack_00003af8,
                       (bool)in_stack_ffffffffffffff1b);
            pMVar3 = &local_9f0;
            local_5f8 = pMVar3;
            local_3c0 = pMVar3;
            if (local_9f0.refcount != (int *)0x0) {
              local_3c4 = 0xffffffff;
              LOCK();
              local_3c8 = *local_9f0.refcount;
              *local_9f0.refcount = *local_9f0.refcount + -1;
              UNLOCK();
              if (local_3c8 == 1) {
                if (local_9f0.allocator == (Allocator *)0x0) {
                  in_stack_ffffffffffffff20 = (Mat *)local_9f0.data;
                  if ((Mat *)local_9f0.data != (Mat *)0x0) {
                    free(local_9f0.data);
                  }
                }
                else {
                  (*(local_9f0.allocator)->_vptr_Allocator[3])(local_9f0.allocator,local_9f0.data);
                }
              }
            }
            pMVar3->data = (void *)0x0;
            pMVar3->elemsize = 0;
            pMVar3->elempack = 0;
            pMVar3->dims = 0;
            pMVar3->w = 0;
            pMVar3->h = 0;
            pMVar3->d = 0;
            pMVar3->c = 0;
            pMVar3->cstep = 0;
            pMVar3->refcount = (int *)0x0;
            pMVar3 = &local_960;
            local_5e8 = pMVar3;
            local_3e0 = pMVar3;
            if (local_960.refcount != (int *)0x0) {
              local_3e4 = 0xffffffff;
              LOCK();
              local_3e8 = *local_960.refcount;
              *local_960.refcount = *local_960.refcount + -1;
              UNLOCK();
              if (local_3e8 == 1) {
                if (local_960.allocator == (Allocator *)0x0) {
                  in_stack_ffffffffffffff30 = (Mat *)local_960.data;
                  if ((Mat *)local_960.data != (Mat *)0x0) {
                    free(local_960.data);
                  }
                }
                else {
                  (*(local_960.allocator)->_vptr_Allocator[3])(local_960.allocator,local_960.data);
                }
              }
            }
            pMVar3->data = (void *)0x0;
            pMVar3->elemsize = 0;
            pMVar3->elempack = 0;
            pMVar3->dims = 0;
            pMVar3->w = 0;
            pMVar3->h = 0;
            pMVar3->d = 0;
            pMVar3->c = 0;
            pMVar3->cstep = 0;
            pMVar3->refcount = (int *)0x0;
          }
          if (in_stack_00000010 != 0) {
            transpose_unpack_output_tile
                      (in_stack_fffffffffffff478,in_stack_fffffffffffff470,
                       (int)((ulong)in_stack_fffffffffffff468 >> 0x20),
                       (int)in_stack_fffffffffffff468,in_stack_fffffffffffff464,
                       in_stack_fffffffffffff460);
          }
        }
        local_5d8 = &stack0xfffffffffffff758;
        local_400 = local_5d8;
      }
      local_654 = 0;
    }
    local_700 = 1;
    local_5c8 = &local_848;
    local_420 = local_5c8;
    if (local_840 != (int *)0x0) {
      local_424 = 0xffffffff;
      LOCK();
      local_428 = *local_840;
      *local_840 = *local_840 + -1;
      UNLOCK();
      if (local_428 == 1) {
        if (local_828 == (long *)0x0) {
          if (local_848 != (void *)0x0) {
            free(local_848);
          }
        }
        else {
          (**(code **)(*local_828 + 0x18))(local_828,local_848);
        }
      }
    }
    local_848 = (void *)0x0;
    local_838 = 0;
    local_830 = 0;
    local_820 = 0;
    local_81c = 0;
    local_818 = 0;
    local_814 = 0;
    local_840 = (int *)0x0;
  }
  else {
    local_654 = -100;
    local_700 = 1;
  }
  local_5b8 = &local_748;
  local_440 = local_5b8;
  if (local_740 != (int *)0x0) {
    local_444 = 0xffffffff;
    LOCK();
    local_448 = *local_740;
    *local_740 = *local_740 + -1;
    UNLOCK();
    if (local_448 == 1) {
      if (local_728 == (Allocator *)0x0) {
        if (local_748 != (void *)0x0) {
          free(local_748);
        }
      }
      else {
        (*local_728->_vptr_Allocator[3])(local_728,local_748);
      }
    }
  }
  local_748 = (void *)0x0;
  local_738 = 0;
  local_730 = 0;
  local_720 = 0;
  local_71c = 0;
  local_718 = 0;
  local_714 = 0;
  local_710 = 0;
  local_708 = 0;
  local_740 = (int *)0x0;
LAB_0184aa1d:
  local_5a8 = &local_6f0;
  if (local_6e8 != (int *)0x0) {
    local_464 = 0xffffffff;
    LOCK();
    local_468 = *local_6e8;
    *local_6e8 = *local_6e8 + -1;
    UNLOCK();
    if (local_468 == 1) {
      local_460 = local_5a8;
      if (local_6d0 == (Allocator *)0x0) {
        if (local_6f0 != (void *)0x0) {
          free(local_6f0);
        }
      }
      else {
        (*local_6d0->_vptr_Allocator[3])(local_6d0,local_6f0);
      }
    }
  }
  return local_654;
}

Assistant:

static int gemm_x86(const Mat& A, const Mat& B, const Mat& C, Mat& top_blob, int broadcast_type_C, int transA, int transB, int output_transpose, int constant_TILE_M, int constant_TILE_N, int constant_TILE_K, int nT, const Option& opt)
{
    const int M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
    const int K = transA ? (A.dims == 3 ? A.c : A.h) * A.elempack : A.w;
    const int N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;

    // NCNN_LOGE("M/N/K = %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, nT);

    // NCNN_LOGE("TILE M/N/K = %d %d %d", TILE_M, TILE_N, TILE_K);

    int nn_M = (M + TILE_M - 1) / TILE_M;
    int nn_N = (N + TILE_N - 1) / TILE_N;
    int nn_K = (K + TILE_K - 1) / TILE_K;

    Mat ATX(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, nT, 4u, opt.workspace_allocator);
    if (ATX.empty())
        return -100;
    Mat BT(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    // pack B
    #pragma omp parallel for num_threads(nT)
    for (int ppjk = 0; ppjk < nn_NK; ppjk++)
    {
        const int ppj = ppjk / nn_K;
        const int ppk = ppjk % nn_K;

        const int j = ppj * TILE_N;
        const int k = ppk * TILE_K;

        const int max_jj = std::min((N - j), TILE_N);
        const int max_kk = std::min((K - k), TILE_K);

        Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

        if (transB)
        {
            pack_B_tile(B, BT_tile, j, max_jj, k, max_kk);
        }
        else
        {
            transpose_pack_B_tile(B, BT_tile, j, max_jj, k, max_kk);
        }
    }

    Mat topT;
    if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
    {
        topT.create(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);
        if (topT.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(nT)
    for (int ppi = 0; ppi < nn_M; ppi++)
    {
        const int i = ppi * TILE_M;

        // shadowed variable for less openmp task args
        const int M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        const int K = transA ? (A.dims == 3 ? A.c : A.h) * A.elempack : A.w;

        const int max_ii = std::min((M - i), TILE_M);

        Mat topT_tile;
        if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
            topT_tile = topT.channel(get_omp_thread_num());

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            if (broadcast_type_C == 3)
            {
                pack_A_tile(C, topT_tile, i, max_ii, j, max_jj);
            }

            const Mat& CT_tile = broadcast_type_C == 3 ? topT_tile : C;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                // NCNN_LOGE("max_ii/jj/kk = %d %d %d", max_ii, max_jj, max_kk);

                Mat AT_tile = ATX.channel(get_omp_thread_num()).row_range(k / TILE_K, 1);

                Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                if (j == 0)
                {
                    if (transA)
                    {
                        transpose_pack_A_tile(A, AT_tile, i, max_ii, k, max_kk);
                    }
                    else
                    {
                        pack_A_tile(A, AT_tile, i, max_ii, k, max_kk);
                    }
                }

                bool k_end = !output_transpose && k + TILE_K >= K;

                gemm_transB_packed_tile(AT_tile, BT_tile, CT_tile, topT_tile, top_blob, broadcast_type_C, i, max_ii, j, max_jj, k, max_kk, k_end);
            }

            if (output_transpose)
            {
                transpose_unpack_output_tile(topT_tile, top_blob, i, max_ii, j, max_jj);
            }
        }
    }

    return 0;
}